

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O2

string * tokens_to_str<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                   (string *__return_storage_ptr__,llama_context *ctx,
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
                   __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end)

{
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    common_token_to_piece_abi_cxx11_(&local_50,ctx,*begin._M_current,true);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string tokens_to_str(llama_context * ctx, Iter begin, Iter end) {
    std::string ret;
    for (; begin != end; ++begin) {
        ret += common_token_to_piece(ctx, *begin);
    }

    return ret;
}